

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

hash_table_entry_t * hash_table_find(unsigned_long hash,hash_table_t *hash_table)

{
  hash_table_entry_t *phVar1;
  
  for (phVar1 = hash_table->entries + hash % hash_table->capacity;
      (phVar1 != (hash_table_entry_t *)0x0 && ((phVar1->hash != hash || (phVar1->filled == 0))));
      phVar1 = phVar1->next) {
  }
  return phVar1;
}

Assistant:

static hash_table_entry_t* hash_table_find(unsigned long hash, hash_table_t* hash_table)
{
  hash_table_entry_t* entry = hash_table->entries + (hash % hash_table->capacity);
  while (entry)
  {
    if (entry->hash == hash && entry->filled)
    {
      return entry;
    }
    entry = entry->next;
  }
  return NULL;
}